

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

int xmlTextReaderPushData(xmlTextReaderPtr reader)

{
  xmlTextReaderState xVar1;
  xmlBufPtr buf;
  int iVar2;
  size_t sVar3;
  xmlChar *pxVar4;
  xmlParserCtxtPtr pxVar5;
  uint uVar6;
  int size;
  
  iVar2 = -1;
  if ((reader->input != (xmlParserInputBufferPtr)0x0) &&
     (buf = reader->input->buffer, buf != (xmlBufPtr)0x0)) {
    xVar1 = reader->state;
    reader->state = XML_TEXTREADER_NONE;
LAB_00173740:
    sVar3 = xmlBufUse(buf);
    if (sVar3 < reader->cur + 0x200) {
      if (reader->mode == 3) {
LAB_0017388b:
        reader->state = xVar1;
        goto LAB_0017388f;
      }
      iVar2 = xmlParserInputBufferRead(reader->input,0x1000);
      if (iVar2 == 0) {
        sVar3 = xmlBufUse(buf);
        if (sVar3 == reader->cur) {
          reader->mode = 3;
          goto LAB_0017388b;
        }
      }
      else if (iVar2 < 0) {
        xmlCtxtErrIO(reader->ctxt,reader->input->error,(char *)0x0);
        reader->mode = 2;
        reader->state = XML_TEXTREADER_ERROR;
        goto LAB_00173903;
      }
    }
    sVar3 = xmlBufUse(buf);
    if (reader->cur + 0x200 <= sVar3) {
      pxVar5 = reader->ctxt;
      pxVar4 = xmlBufContent(buf);
      iVar2 = xmlParseChunk(pxVar5,(char *)(pxVar4 + reader->cur),0x200,0);
      uVar6 = reader->cur + 0x200;
      reader->cur = uVar6;
      pxVar5 = reader->ctxt;
      if (iVar2 != 0) goto LAB_00173820;
      if ((pxVar5->wellFormed == 0) || (reader->state != XML_TEXTREADER_NONE)) goto LAB_00173827;
      goto LAB_00173740;
    }
    sVar3 = xmlBufUse(buf);
    size = (int)sVar3 - reader->cur;
    pxVar5 = reader->ctxt;
    pxVar4 = xmlBufContent(buf);
    iVar2 = xmlParseChunk(pxVar5,(char *)(pxVar4 + reader->cur),size,0);
    uVar6 = size + reader->cur;
    reader->cur = uVar6;
    if (iVar2 != 0) {
      pxVar5 = reader->ctxt;
LAB_00173820:
      pxVar5->wellFormed = 0;
    }
LAB_00173827:
    reader->state = xVar1;
    if (reader->mode == 3) {
LAB_0017388f:
      if (xVar1 != XML_TEXTREADER_DONE) {
        sVar3 = xmlBufUse(buf);
        uVar6 = reader->cur;
        pxVar5 = reader->ctxt;
        pxVar4 = xmlBufContent(buf);
        iVar2 = xmlParseChunk(pxVar5,(char *)(pxVar4 + reader->cur),(int)sVar3 - uVar6,1);
        sVar3 = xmlBufUse(buf);
        reader->cur = (uint)sVar3;
        reader->state = XML_TEXTREADER_DONE;
        if (iVar2 != 0) {
          if (reader->ctxt->wellFormed == 0) {
            return -1;
          }
          reader->ctxt->wellFormed = 0;
        }
      }
    }
    else if ((reader->mode == 1) && (0x50 < uVar6)) {
      sVar3 = xmlBufShrink(buf,(ulong)(uVar6 - 0x50));
      if (-1 < (int)sVar3) {
        reader->cur = reader->cur - (int)sVar3;
      }
    }
    iVar2 = 0;
    if (reader->ctxt->wellFormed == 0) {
      reader->mode = 3;
LAB_00173903:
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

static int
xmlTextReaderPushData(xmlTextReaderPtr reader) {
    xmlBufPtr inbuf;
    int val, s;
    xmlTextReaderState oldstate;

    if ((reader->input == NULL) || (reader->input->buffer == NULL))
	return(-1);

    oldstate = reader->state;
    reader->state = XML_TEXTREADER_NONE;
    inbuf = reader->input->buffer;

    while (reader->state == XML_TEXTREADER_NONE) {
	if (xmlBufUse(inbuf) < reader->cur + CHUNK_SIZE) {
	    /*
	     * Refill the buffer unless we are at the end of the stream
	     */
	    if (reader->mode != XML_TEXTREADER_MODE_EOF) {
		val = xmlParserInputBufferRead(reader->input, 4096);
		if (val == 0) {
		    if (xmlBufUse(inbuf) == reader->cur) {
			reader->mode = XML_TEXTREADER_MODE_EOF;
                        break;
		    }
		} else if (val < 0) {
                    xmlCtxtErrIO(reader->ctxt, reader->input->error, NULL);
                    reader->mode = XML_TEXTREADER_MODE_ERROR;
                    reader->state = XML_TEXTREADER_ERROR;
                    return(-1);
		}

	    } else
		break;
	}
	/*
	 * parse by block of CHUNK_SIZE bytes, various tests show that
	 * it's the best tradeoff at least on a 1.2GH Duron
	 */
	if (xmlBufUse(inbuf) >= reader->cur + CHUNK_SIZE) {
	    val = xmlParseChunk(reader->ctxt,
                 (const char *) xmlBufContent(inbuf) + reader->cur,
                                CHUNK_SIZE, 0);
	    reader->cur += CHUNK_SIZE;
	    if (val != 0)
		reader->ctxt->wellFormed = 0;
	    if (reader->ctxt->wellFormed == 0)
		break;
	} else {
	    s = xmlBufUse(inbuf) - reader->cur;
	    val = xmlParseChunk(reader->ctxt,
		 (const char *) xmlBufContent(inbuf) + reader->cur,
			        s, 0);
	    reader->cur += s;
	    if (val != 0)
		reader->ctxt->wellFormed = 0;
	    break;
	}
    }
    reader->state = oldstate;

    /*
     * Discard the consumed input when needed and possible
     */
    if (reader->mode == XML_TEXTREADER_MODE_INTERACTIVE) {
        if (reader->cur > 80 /* LINE_LEN */) {
            val = xmlBufShrink(inbuf, reader->cur - 80);
            if (val >= 0) {
                reader->cur -= val;
            }
        }
    }

    /*
     * At the end of the stream signal that the work is done to the Push
     * parser.
     */
    else if (reader->mode == XML_TEXTREADER_MODE_EOF) {
	if (reader->state != XML_TEXTREADER_DONE) {
	    s = xmlBufUse(inbuf) - reader->cur;
	    val = xmlParseChunk(reader->ctxt,
		 (const char *) xmlBufContent(inbuf) + reader->cur,
			        s, 1);
	    reader->cur = xmlBufUse(inbuf);
	    reader->state  = XML_TEXTREADER_DONE;
	    if (val != 0) {
	        if (reader->ctxt->wellFormed)
		    reader->ctxt->wellFormed = 0;
		else
		    return(-1);
	    }
	}
    }
    if (reader->ctxt->wellFormed == 0) {
	reader->mode = XML_TEXTREADER_MODE_EOF;
        return(-1);
    }

    return(0);
}